

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

string * __thiscall
cmNinjaTargetGenerator::GetClangTidyReplacementsFilePath
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,string *directory,
          cmSourceFile *source,string *config)

{
  cmLocalNinjaGenerator *pcVar1;
  pointer pcVar2;
  string *psVar3;
  cmGlobalNinjaGenerator *pcVar4;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string local_158;
  long *local_138;
  undefined8 local_130;
  long local_128 [2];
  long *local_118;
  undefined8 local_110;
  long local_108 [2];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined1 *local_e8;
  undefined1 local_e0 [32];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_c0;
  undefined8 local_a8;
  long *local_a0;
  long **local_98;
  size_type local_90;
  long *local_88;
  long **local_80;
  undefined8 local_78;
  undefined1 *local_70;
  undefined8 local_68;
  size_type local_60;
  pointer local_58;
  undefined8 local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  
  pcVar1 = this->LocalGenerator;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pcVar1->HomeRelativeOutputPath)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,
             pcVar2 + (pcVar1->HomeRelativeOutputPath)._M_string_length);
  if (__return_storage_ptr__->_M_string_length != 0) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  local_c0.first._M_str = (directory->_M_dataplus)._M_p;
  local_c0.first._M_len = directory->_M_string_length;
  local_c0.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_f8 = 0;
  local_f0 = 1;
  local_e0[0] = 0x2f;
  local_a8 = 1;
  local_98 = (long **)0x0;
  local_88 = (long *)(__return_storage_ptr__->_M_dataplus)._M_p;
  local_90 = __return_storage_ptr__->_M_string_length;
  local_80 = (long **)0x0;
  views._M_len = 3;
  views._M_array = &local_c0;
  local_e8 = local_e0;
  local_a0 = (long *)local_e0;
  cmCatViews(&local_158,views);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  psVar3 = cmGeneratorTarget::GetObjectName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget,source);
  (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
    super_cmOutputConverter._vptr_cmOutputConverter[0x10])
            (&local_118,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  pcVar4 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  (*(pcVar4->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x4d])
            (&local_138,pcVar4,config);
  local_c0.first._M_str = (__return_storage_ptr__->_M_dataplus)._M_p;
  local_c0.first._M_len = __return_storage_ptr__->_M_string_length;
  local_a8 = local_110;
  local_a0 = local_118;
  local_90 = local_130;
  local_88 = local_138;
  local_f8 = 0;
  local_f0 = 1;
  local_e0[0] = 0x2f;
  local_78 = 1;
  local_68 = 0;
  local_58 = (psVar3->_M_dataplus)._M_p;
  local_60 = psVar3->_M_string_length;
  local_50 = 0;
  local_48 = 5;
  local_40 = ".yaml";
  local_38 = 0;
  views_00._M_len = 6;
  views_00._M_array = &local_c0;
  local_e8 = local_e0;
  local_c0.second = __return_storage_ptr__;
  local_98 = &local_118;
  local_80 = &local_138;
  local_70 = local_e0;
  cmCatViews(&local_158,views_00);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if (local_138 != local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  if (local_118 != local_108) {
    operator_delete(local_118,local_108[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::GetClangTidyReplacementsFilePath(
  std::string const& directory, cmSourceFile const& source,
  std::string const& config) const
{
  auto path = this->LocalGenerator->GetHomeRelativeOutputPath();
  if (!path.empty()) {
    path += '/';
  }
  path = cmStrCat(directory, '/', path);
  auto const& objectName = this->GeneratorTarget->GetObjectName(&source);
  path =
    cmStrCat(std::move(path),
             this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget),
             this->GetGlobalGenerator()->ConfigDirectory(config), '/',
             objectName, ".yaml");
  return path;
}